

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_insn_t_conflict
MIR_new_insn_arr(MIR_context_t ctx,MIR_insn_code_t code,size_t nops,MIR_op_t *ops)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  VARR_MIR_proto_t *pVVar4;
  VARR_MIR_var_t *pVVar5;
  MIR_var_t *pMVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  size_t sVar14;
  MIR_proto_t *ppMVar15;
  MIR_insn_t_conflict pMVar16;
  MIR_proto_t extraout_RAX;
  MIR_proto_t pMVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  size_t extraout_RDX;
  long unaff_RBP;
  char *pcVar22;
  char *varr;
  MIR_error_type_t MVar23;
  ulong uVar24;
  int unaff_R13D;
  code *pcVar25;
  MIR_error_func_t local_38;
  
  sVar14 = insn_code_nops(ctx,code);
  if (ops == (MIR_op_t *)0x0 && nops != 0) {
LAB_001333d1:
    __assert_fail("nops == 0 || ops != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x890,
                  "MIR_insn_t MIR_new_insn_arr(MIR_context_t, MIR_insn_code_t, size_t, MIR_op_t *)")
    ;
  }
  if (code - MIR_SWITCH < 0xfffffffd) {
    if ((int)code < 0xb5) {
      if (code == MIR_SWITCH) goto LAB_001330e4;
      if (code != MIR_RET) goto LAB_001330c5;
    }
    else if ((code != MIR_UNSPEC) && (code != MIR_USE)) {
      if (code != MIR_PHI) {
LAB_001330c5:
        if (sVar14 != nops) goto LAB_00133527;
        goto LAB_001330ce;
      }
      goto LAB_0013317c;
    }
  }
  else {
LAB_001330ce:
    if (code == MIR_PHI) {
LAB_0013317c:
      if (nops < 3) {
        pcVar22 = "number of MIR_PHI operands is less 3";
        goto LAB_001334e9;
      }
      goto LAB_0013334f;
    }
    if (code == MIR_SWITCH) {
LAB_001330e4:
      if (nops < 2) {
        pcVar22 = "number of MIR_SWITCH operands is less 2";
        goto LAB_001334e9;
      }
      goto LAB_0013334f;
    }
  }
  if ((int)code < 0xb0) {
    if (code - MIR_CALL < 3) {
LAB_00133118:
      uVar19 = (ulong)(code != MIR_UNSPEC) + 1;
      if (nops < uVar19) goto LAB_001334e2;
      if (code != MIR_UNSPEC) {
        if ((ops->field_0x8 != '\b') || (*(int *)&((ops->u).label)->ops[0].data != 1)) {
          pcVar22 = "the 1st call operand should be a prototype";
          MVar23 = MIR_call_op_error;
          goto LAB_00133522;
        }
        ppMVar15 = (MIR_proto_t *)((long)&((ops->u).label)->ops[0].u + 0x10);
LAB_00133214:
        pMVar17 = *ppMVar15;
        uVar18 = (ulong)pMVar17->nres;
        if (pMVar17->args != (VARR_MIR_var_t *)0x0) {
          uVar18 = uVar18 + pMVar17->args->els_num;
        }
        if (nops < uVar18 + uVar19) goto LAB_001334b1;
        if ((uVar18 + uVar19 != nops) && (pMVar17->vararg_p == '\0')) goto LAB_001334b1;
        if (uVar19 < nops) {
          pcVar25 = (code *)(uVar19 * 3);
          unaff_R13D = (int)pcVar25;
          uVar18 = (ulong)(uint)(unaff_R13D << 4);
          unaff_RBP = 0;
          uVar24 = 0;
          do {
            if (((&ops->field_0x8)[unaff_RBP * 2 + uVar18] == '\n') &&
               (bVar3 = *(byte *)((long)&ops->u + unaff_RBP * 2 + uVar18), 0xfffffff9 < bVar3 - 0x12
               )) {
              uVar20 = (ulong)pMVar17->nres;
              sVar14 = uVar24 - uVar20;
              if (uVar24 < uVar20) {
LAB_001333a7:
                pcVar22 = "call";
                if (code == MIR_UNSPEC) {
                  pcVar22 = "unspec";
                }
                varr = "result of %s is block type memory";
LAB_00133459:
                MVar23 = MIR_wrong_type_error;
                goto LAB_0013345e;
              }
              varr = (char *)pMVar17->args;
              if ((VARR_MIR_var_t *)varr == (VARR_MIR_var_t *)0x0) {
                MIR_new_insn_arr_cold_2();
                goto LAB_001333d1;
              }
              if (sVar14 < ((VARR_MIR_var_t *)varr)->els_num) {
                pMVar6 = ((VARR_MIR_var_t *)varr)->varr;
                if (pMVar6 == (MIR_var_t *)0x0) goto LAB_001334ac;
                if (*(uint *)((long)&pMVar6[-uVar20].type + unaff_RBP) != (uint)bVar3) {
                  pcVar22 = "call";
                  if (code == MIR_UNSPEC) {
                    pcVar22 = "unspec";
                  }
                  varr = "arg of %s is block type memory but param is not of block type";
                  goto LAB_00133459;
                }
                if (*(long *)((long)&pMVar6[-uVar20].size + unaff_RBP) !=
                    *(long *)((long)&ops->u + unaff_RBP * 2 + uVar18 + 0x18)) goto LAB_00133463;
              }
              else if (bVar3 == 0x11) {
LAB_00133417:
                pcVar22 = "call";
                if (code == MIR_UNSPEC) {
                  pcVar22 = "unspec";
                }
                varr = "RBLK memory can not correspond to unnamed param in %s insn";
                goto LAB_00133459;
              }
            }
            else {
              uVar20 = (ulong)pMVar17->nres;
              if (uVar20 <= uVar24) {
                pVVar5 = pMVar17->args;
                if (pVVar5 == (VARR_MIR_var_t *)0x0) {
                  MIR_new_insn_arr_cold_4();
                  goto LAB_001333a7;
                }
                if (uVar24 - uVar20 < pVVar5->els_num) {
                  if (pVVar5->varr == (MIR_var_t *)0x0) {
                    MIR_new_insn_arr_cold_3();
                    goto LAB_00133417;
                  }
                  if (0xfffffff9 < *(int *)((long)&pVVar5->varr[-uVar20].type + unaff_RBP) - 0x12U)
                  {
                    pcVar22 = "call";
                    if (code == MIR_UNSPEC) {
                      pcVar22 = "unspec";
                    }
                    varr = "param of %s is of block type but arg is not of block type memory";
                    goto LAB_00133459;
                  }
                }
              }
            }
            uVar24 = uVar24 + 1;
            unaff_RBP = unaff_RBP + 0x18;
          } while (nops - uVar19 != uVar24);
        }
LAB_0013334f:
        pMVar16 = create_insn(ctx,nops,code);
        *(int *)&pMVar16->field_0x1c = (int)nops;
        if (nops != 0) {
          lVar21 = 0;
          do {
            puVar1 = (undefined8 *)((long)&ops->data + lVar21);
            uVar7 = *puVar1;
            uVar8 = puVar1[1];
            uVar9 = puVar1[2];
            uVar10 = puVar1[3];
            puVar1 = (undefined8 *)((long)&ops->u + lVar21);
            uVar11 = puVar1[1];
            uVar12 = puVar1[2];
            uVar13 = puVar1[3];
            puVar2 = (undefined8 *)((long)&pMVar16->ops[0].u + lVar21);
            *puVar2 = *puVar1;
            puVar2[1] = uVar11;
            puVar2[2] = uVar12;
            puVar2[3] = uVar13;
            puVar1 = (undefined8 *)((long)&pMVar16->ops[0].data + lVar21);
            *puVar1 = uVar7;
            puVar1[1] = uVar8;
            puVar1[2] = uVar9;
            puVar1[3] = uVar10;
            lVar21 = lVar21 + 0x30;
            nops = nops - 1;
          } while (nops != 0);
        }
        return pMVar16;
      }
      if (ops->field_0x8 != '\x03') {
LAB_001334fe:
        pcVar22 = "the 1st unspec operand should be valid unspec code";
        MVar23 = MIR_unspec_op_error;
        goto LAB_00133522;
      }
      pVVar4 = ctx->unspec_protos;
      if (pVVar4 == (VARR_MIR_proto_t *)0x0) {
        MIR_new_insn_arr_cold_6();
      }
      else {
        if (pVVar4->els_num <= (ops->u).u) goto LAB_001334fe;
        if (pVVar4->varr != (MIR_proto_t *)0x0) {
          ppMVar15 = pVVar4->varr + (ops->u).u;
          goto LAB_00133214;
        }
      }
      MIR_new_insn_arr_cold_5();
LAB_00133516:
      pcVar22 = "property should be a integer operand";
    }
    else {
LAB_001331b9:
      if (1 < code - MIR_PRBEQ) goto LAB_0013334f;
      if (ops[2].field_0x8 != '\x03') goto LAB_00133516;
      if ((ops[1].field_0x8 == '\x01') || (ops[1].field_0x8 == '\n')) goto LAB_0013334f;
      pcVar22 = "2nd operand of property branch should be any memory or reg with given type";
    }
  }
  else {
    if (code != MIR_VA_ARG) {
      if (code != MIR_PRSET) {
        if (code != MIR_UNSPEC) goto LAB_001331b9;
        goto LAB_00133118;
      }
      if (ops[1].field_0x8 == '\x03') goto LAB_0013334f;
      goto LAB_00133516;
    }
    if (ops[2].field_0x8 == '\n') goto LAB_0013334f;
    pcVar22 = "3rd operand of va_arg should be any memory with given type";
  }
  MVar23 = MIR_op_mode_error;
LAB_00133522:
  do {
    (*ctx->error_func)(MVar23,pcVar22);
LAB_00133527:
    pcVar22 = insn_descs[code].name;
    varr = "wrong number of operands for insn %s";
    MVar23 = MIR_ops_num_error;
LAB_0013345e:
    (*ctx->error_func)(MVar23,varr,pcVar22);
    sVar14 = extraout_RDX;
LAB_00133463:
    pcVar25 = (code *)((long)&ops->data + (ulong)(uint)(unaff_R13D << 4));
    ops = (MIR_op_t *)ctx->error_func;
    VARR_MIR_var_tget((MIR_var_t *)&stack0xffffffffffffffb8,(VARR_MIR_var_t *)varr,sVar14);
    pcVar22 = "call";
    if (code == MIR_UNSPEC) {
      pcVar22 = "unspec";
    }
    (*(code *)ops)(0x12,"different sizes (%lu vs %lu) of arg and param block memory in %s insn",
                   local_38,*(undefined8 *)(pcVar25 + unaff_RBP * 2 + 0x28),pcVar22);
    ctx = (MIR_context_t)&stack0xffffffffffffffb8;
LAB_001334ac:
    unaff_R13D = (int)pcVar25;
    MIR_new_insn_arr_cold_1();
    pMVar17 = extraout_RAX;
LAB_001334b1:
    pcVar22 = "call";
    if (code == MIR_UNSPEC) {
      pcVar22 = "unspec";
    }
    (*ctx->error_func)(code == MIR_UNSPEC | MIR_call_op_error,
                       "number of %s operands or results does not correspond to prototype %s",
                       pcVar22,pMVar17->name);
LAB_001334e2:
    pcVar22 = "wrong number of call/unspec operands";
LAB_001334e9:
    MVar23 = MIR_ops_num_error;
  } while( true );
}

Assistant:

MIR_insn_t MIR_new_insn_arr (MIR_context_t ctx, MIR_insn_code_t code, size_t nops, MIR_op_t *ops) {
  MIR_insn_t insn;
  MIR_proto_t proto;
  size_t args_start, narg, i = 0, expected_nops = insn_code_nops (ctx, code);
  mir_assert (nops == 0 || ops != NULL);

  if (!MIR_call_code_p (code) && code != MIR_UNSPEC && code != MIR_USE && code != MIR_PHI
      && code != MIR_RET && code != MIR_SWITCH && nops != expected_nops) {
    MIR_get_error_func (ctx) (MIR_ops_num_error, "wrong number of operands for insn %s",
                              insn_descs[code].name);
  } else if (code == MIR_SWITCH) {
    if (nops < 2)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "number of MIR_SWITCH operands is less 2");
  } else if (code == MIR_PHI) {
    if (nops < 3)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "number of MIR_PHI operands is less 3");
  } else if (MIR_call_code_p (code) || code == MIR_UNSPEC) {
    args_start = code == MIR_UNSPEC ? 1 : 2;
    if (nops < args_start)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "wrong number of call/unspec operands");
    if (code == MIR_UNSPEC) {
      if (ops[0].mode != MIR_OP_INT || ops[0].u.u >= VARR_LENGTH (MIR_proto_t, unspec_protos))
        MIR_get_error_func (ctx) (MIR_unspec_op_error,
                                  "the 1st unspec operand should be valid unspec code");
      proto = VARR_GET (MIR_proto_t, unspec_protos, ops[0].u.u);
    } else {
      if (ops[0].mode != MIR_OP_REF || ops[0].u.ref->item_type != MIR_proto_item)
        MIR_get_error_func (ctx) (MIR_call_op_error, "the 1st call operand should be a prototype");
      proto = ops[0].u.ref->u.proto;
    }
    i = proto->nres;
    if (proto->args != NULL) i += VARR_LENGTH (MIR_var_t, proto->args);
    if (nops < i + args_start || (nops != i + args_start && !proto->vararg_p))
      MIR_get_error_func (
        ctx) (code == MIR_UNSPEC ? MIR_unspec_op_error : MIR_call_op_error,
              "number of %s operands or results does not correspond to prototype %s",
              code == MIR_UNSPEC ? "unspec" : "call", proto->name);
    for (i = args_start; i < nops; i++) {
      if (ops[i].mode == MIR_OP_MEM && MIR_all_blk_type_p (ops[i].u.mem.type)) {
        if (i - args_start < proto->nres)
          MIR_get_error_func (ctx) (MIR_wrong_type_error, "result of %s is block type memory",
                                    code == MIR_UNSPEC ? "unspec" : "call");
        else if ((narg = i - args_start - proto->nres) < VARR_LENGTH (MIR_var_t, proto->args)) {
          if (VARR_GET (MIR_var_t, proto->args, narg).type != ops[i].u.mem.type) {
            MIR_get_error_func (
              ctx) (MIR_wrong_type_error,
                    "arg of %s is block type memory but param is not of block type",
                    code == MIR_UNSPEC ? "unspec" : "call");
          } else if (VARR_GET (MIR_var_t, proto->args, narg).size != (size_t) ops[i].u.mem.disp) {
            MIR_get_error_func (
              ctx) (MIR_wrong_type_error,
                    "different sizes (%lu vs %lu) of arg and param block memory in %s insn",
                    (unsigned long) VARR_GET (MIR_var_t, proto->args, narg).size,
                    (unsigned long) ops[i].u.mem.disp, code == MIR_UNSPEC ? "unspec" : "call");
          }
        } else if (ops[i].u.mem.type == MIR_T_RBLK) {
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "RBLK memory can not correspond to unnamed param in %s insn",
                                    code == MIR_UNSPEC ? "unspec" : "call");
        }
      } else if (i - args_start >= proto->nres
                 && (narg = i - args_start - proto->nres) < VARR_LENGTH (MIR_var_t, proto->args)
                 && MIR_all_blk_type_p (VARR_GET (MIR_var_t, proto->args, narg).type)) {
        MIR_get_error_func (
          ctx) (MIR_wrong_type_error,
                "param of %s is of block type but arg is not of block type memory",
                code == MIR_UNSPEC ? "unspec" : "call");
      }
    }
  } else if (code == MIR_VA_ARG) {  // undef mem ???
    if (ops[2].mode != MIR_OP_MEM)
      MIR_get_error_func (ctx) (MIR_op_mode_error,
                                "3rd operand of va_arg should be any memory with given type");
  } else if (code == MIR_PRSET) {
    if (ops[1].mode != MIR_OP_INT)
      MIR_get_error_func (ctx) (MIR_op_mode_error, "property should be a integer operand");
  } else if (code == MIR_PRBEQ || code == MIR_PRBNE) {
    if (ops[2].mode != MIR_OP_INT)
      MIR_get_error_func (ctx) (MIR_op_mode_error, "property should be a integer operand");
    if (ops[1].mode != MIR_OP_REG && ops[1].mode != MIR_OP_MEM)
      MIR_get_error_func (
        ctx) (MIR_op_mode_error,
              "2nd operand of property branch should be any memory or reg with given type");
  }
  insn = create_insn (ctx, nops, code);
  insn->nops = (unsigned int) nops;
  for (i = 0; i < nops; i++) insn->ops[i] = ops[i];
  return insn;
}